

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_proxy_module.c
# Opt level: O0

void ngx_http_proxy_set_vars(ngx_url_t *u,ngx_http_proxy_vars_t *v)

{
  ngx_http_proxy_vars_t *v_local;
  ngx_url_t *u_local;
  
  if (u->family == 1) {
    (v->host_header).len = 9;
    (v->host_header).data = (u_char *)"localhost";
    (v->port).len = 0;
    (v->port).data = (u_char *)0x0;
    (v->key_start).len = (u->host).len + 6 + (v->key_start).len;
  }
  else {
    if ((((byte)u->field_0x48 >> 3 & 1) == 0) && (u->port != u->default_port)) {
      (v->host_header).len = (u->host).len + 1 + (u->port_text).len;
      (v->host_header).data = (u->host).data;
      (v->port).len = (u->port_text).len;
      (v->port).data = (u->port_text).data;
    }
    else {
      (v->host_header).len = (u->host).len;
      (v->host_header).data = (u->host).data;
      if (u->default_port == 0x50) {
        (v->port).len = 2;
        (v->port).data = (u_char *)"80";
      }
      else {
        (v->port).len = 3;
        (v->port).data = (u_char *)"443";
      }
    }
    (v->key_start).len = (v->host_header).len + (v->key_start).len;
  }
  (v->uri).len = (u->uri).len;
  (v->uri).data = (u->uri).data;
  return;
}

Assistant:

static void
ngx_http_proxy_set_vars(ngx_url_t *u, ngx_http_proxy_vars_t *v)
{
    if (u->family != AF_UNIX) {

        if (u->no_port || u->port == u->default_port) {

            v->host_header = u->host;

            if (u->default_port == 80) {
                ngx_str_set(&v->port, "80");

            } else {
                ngx_str_set(&v->port, "443");
            }

        } else {
            v->host_header.len = u->host.len + 1 + u->port_text.len;
            v->host_header.data = u->host.data;
            v->port = u->port_text;
        }

        v->key_start.len += v->host_header.len;

    } else {
        ngx_str_set(&v->host_header, "localhost");
        ngx_str_null(&v->port);
        v->key_start.len += sizeof("unix:") - 1 + u->host.len + 1;
    }

    v->uri = u->uri;
}